

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare.cpp
# Opt level: O3

bool compareData<int>(Serializer *serializer1,Serializer *serializer2,Savepoint *savepoint,
                     DataFieldInfo *info1,DataFieldInfo *info2,IJKLBounds *bounds,double tolerance,
                     vector<bool,_std::allocator<bool>_> *failed)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  _Bit_type *p_Var11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  byte bVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  int iVar23;
  int iVar24;
  int k;
  uint uVar25;
  ulong uVar26;
  bool bVar27;
  double dVar28;
  int *data2;
  int *data1;
  int *local_80;
  int *local_78;
  double local_70;
  IJKLBounds *local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  local_70 = tolerance;
  readData<int>(serializer1,info1,savepoint,&local_78);
  readData<int>(serializer2,info2,savepoint,&local_80);
  iVar1 = info1->jSize_;
  iVar2 = info1->kSize_;
  iVar3 = info1->lSize_;
  iVar20 = iVar2 * iVar3;
  std::vector<bool,_std::allocator<bool>_>::resize
            (failed,(long)(info1->iSize_ * iVar1 * iVar20),false);
  uVar4 = bounds->iLower;
  uVar5 = bounds->iUpper;
  bVar27 = true;
  if ((int)uVar4 <= (int)uVar5) {
    uVar6 = bounds->jLower;
    uVar7 = bounds->jUpper;
    uVar8 = bounds->kLower;
    local_48 = (ulong)uVar8;
    uVar9 = bounds->kUpper;
    local_50 = (ulong)uVar9;
    uVar25 = (iVar2 * (iVar1 * uVar4 + uVar6) + uVar8) * iVar3;
    bVar17 = 0;
    do {
      local_58 = (ulong)uVar25;
      local_60 = (ulong)uVar4;
      if ((int)uVar6 <= (int)uVar7) {
        iVar2 = bounds->lLower;
        local_38 = (long)iVar2;
        iVar10 = bounds->lUpper;
        iVar23 = iVar2 + uVar25;
        uVar16 = local_58;
        uVar12 = uVar6;
        do {
          local_40 = (ulong)uVar12;
          iVar15 = (int)uVar16;
          if ((int)uVar8 <= (int)uVar9) {
            p_Var11 = (failed->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            uVar26 = local_48;
            iVar24 = iVar23;
            do {
              if (iVar2 <= iVar10) {
                uVar14 = (int)uVar16 + local_38;
                iVar18 = (iVar10 - iVar2) + 1;
                iVar21 = iVar24;
                do {
                  dVar28 = (double)local_80[uVar14];
                  iVar13 = iVar21 + 0x3f;
                  if (-1 < iVar21) {
                    iVar13 = iVar21;
                  }
                  iVar13 = iVar13 >> 6;
                  uVar22 = (ulong)((uVar14 & 0x800000000000003f) < 0x8000000000000001);
                  uVar19 = 1L << ((byte)uVar14 & 0x3f);
                  dVar28 = ABS((dVar28 - (double)local_78[uVar14]) /
                               (double)(~-(ulong)(1.0 < ABS(dVar28)) & 0x3ff0000000000000 |
                                       -(ulong)(1.0 < ABS(dVar28)) & (ulong)dVar28));
                  if (dVar28 <= local_70) {
                    uVar19 = ~uVar19 & p_Var11[(long)iVar13 + uVar22 + 0xffffffffffffffff];
                  }
                  else {
                    uVar19 = uVar19 | p_Var11[(long)iVar13 + uVar22 + 0xffffffffffffffff];
                  }
                  p_Var11[(long)iVar13 + uVar22 + 0xffffffffffffffff] = uVar19;
                  bVar17 = bVar17 | local_70 < dVar28;
                  iVar21 = iVar21 + 1;
                  uVar14 = uVar14 + 1;
                  iVar18 = iVar18 + -1;
                } while (iVar18 != 0);
              }
              uVar26 = uVar26 + 1;
              iVar24 = iVar24 + iVar3;
              uVar16 = (ulong)(uint)((int)uVar16 + iVar3);
            } while (uVar9 + 1 != (int)uVar26);
          }
          iVar23 = iVar23 + iVar20;
          uVar16 = (ulong)(uint)(iVar15 + iVar20);
          bVar27 = uVar12 != uVar7;
          uVar12 = uVar12 + 1;
        } while (bVar27);
      }
      uVar25 = uVar25 + iVar20 * iVar1;
      bVar27 = uVar4 != uVar5;
      uVar4 = uVar4 + 1;
    } while (bVar27);
    bVar27 = (bool)(bVar17 ^ 1);
    local_68 = bounds;
  }
  if (local_78 != (int *)0x0) {
    operator_delete__(local_78);
  }
  if (local_80 != (int *)0x0) {
    operator_delete__(local_80);
  }
  return bVar27;
}

Assistant:

bool compareData(const Serializer& serializer1, const Serializer& serializer2,
                 const Savepoint& savepoint,
                 const DataFieldInfo& info1, const DataFieldInfo& info2,
                 const IJKLBounds& bounds,
                 double tolerance, vector<bool>& failed)
{
    T* data1;
    readData(serializer1, info1, savepoint, data1);

    T* data2;
    readData(serializer2, info2, savepoint, data2);

    int iSize = info1.iSize();
    int jSize = info1.jSize();
    int kSize = info1.kSize();
    int lSize = info1.lSize();

    bool notequal = false;
    failed.resize(iSize * jSize * kSize * lSize);

    for (int i = bounds.iLower; i <= bounds.iUpper; ++i) {
        for (int j = bounds.jLower; j <= bounds.jUpper; ++j) {
            for (int k = bounds.kLower; k <= bounds.kUpper; ++k) {
                for (int l = bounds.lLower; l <= bounds.lUpper; ++l) {
                    int index = i * jSize * kSize * lSize + j * kSize * lSize + k * lSize + l;

                    const double val = static_cast<double>(data1[index]);
                    const double ref = static_cast<double>(data2[index]);
                    const double err = std::fabs(ref) > 1. ?
                                       std::fabs((ref - val) / ref) : std::fabs(ref - val);

                    const bool f = err > tolerance         // Error is too large (e.g. val is infinite, ref is not)
                        || ((val != val) != (ref != ref))  // Exactly one is NaN
                        || (err != err && ref != val);     // ref is infinite, val different

                    failed[index] = f;
                    notequal = notequal || f;
                }
            }
        }
    }

    delete [] data1;
    delete [] data2;

    return !notequal;
}